

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BitstringAggBindData::Copy(BitstringAggBindData *this)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  make_uniq<duckdb::BitstringAggBindData,duckdb::BitstringAggBindData_const&>
            ((BitstringAggBindData *)in_RDI._M_head_impl);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::BitstringAggBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this_00._M_head_impl,
             (unique_ptr<duckdb::BitstringAggBindData,_std::default_delete<duckdb::BitstringAggBindData>_>
              *)in_RDI._M_head_impl);
  unique_ptr<duckdb::BitstringAggBindData,_std::default_delete<duckdb::BitstringAggBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BitstringAggBindData,_std::default_delete<duckdb::BitstringAggBindData>,_true>
                 *)0x9940f1);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<BitstringAggBindData>(*this);
	}